

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createInstanceTest(TestStatus *__return_storage_ptr__,Context *context)

{
  VkInstance log;
  TestStatus *pTVar1;
  undefined1 auVar2 [8];
  undefined8 uVar3;
  qpTestResult qVar4;
  ulong uVar5;
  long lVar6;
  VkApplicationInfo *value;
  vector<vk::VkApplicationInfo,_std::allocator<vk::VkApplicationInfo>_> appInfos;
  VkApplicationInfo appInfo;
  ResultCollector resultCollector;
  VkInstanceCreateInfo instanceCreateInfo;
  VkApplicationInfo *local_2b8;
  iterator iStack_2b0;
  VkApplicationInfo *local_2a8;
  DestroyInstanceFunc local_290;
  VkInstance local_288;
  TestStatus *local_280;
  PlatformInterface *local_278;
  undefined1 local_268 [8];
  DestroyInstanceFunc p_Stack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  char *local_248;
  undefined8 uStack_240;
  ios_base local_1f0 [296];
  ResultCollector local_c8;
  VkInstanceCreateInfo local_78;
  
  log = (VkInstance)context->m_testCtx->m_log;
  local_268 = (undefined1  [8])&local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"");
  tcu::ResultCollector::ResultCollector(&local_c8,(TestLog *)log,(string *)local_268);
  local_288 = log;
  local_280 = __return_storage_ptr__;
  if (local_268 != (undefined1  [8])&local_258) {
    operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
  }
  local_278 = context->m_platformInterface;
  local_2b8 = (VkApplicationInfo *)0x0;
  iStack_2b0._M_current = (VkApplicationInfo *)0x0;
  local_2a8 = (VkApplicationInfo *)0x0;
  lVar6 = 0;
  do {
    local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffff00000000);
    p_Stack_260 = (DestroyInstanceFunc)0x0;
    local_258._M_allocated_capacity =
         *(undefined8 *)((long)&PTR_anon_var_dwarf_1ad95f_00d1ba60 + lVar6);
    local_258._8_8_ = local_258._8_8_ & 0xffffffff00000000;
    local_248 = "engineName";
    uStack_240 = 0x40000000000000;
    if (iStack_2b0._M_current == local_2a8) {
      std::vector<vk::VkApplicationInfo,std::allocator<vk::VkApplicationInfo>>::
      _M_realloc_insert<vk::VkApplicationInfo_const&>
                ((vector<vk::VkApplicationInfo,std::allocator<vk::VkApplicationInfo>> *)&local_2b8,
                 iStack_2b0,(VkApplicationInfo *)local_268);
    }
    else {
      (iStack_2b0._M_current)->pEngineName = "engineName";
      (iStack_2b0._M_current)->engineVersion = 0;
      (iStack_2b0._M_current)->apiVersion = 0x400000;
      (iStack_2b0._M_current)->pApplicationName = (char *)local_258._M_allocated_capacity;
      *(undefined8 *)&(iStack_2b0._M_current)->applicationVersion = local_258._8_8_;
      *(undefined1 (*) [8])iStack_2b0._M_current = local_268;
      (iStack_2b0._M_current)->pNext = (void *)0x0;
      iStack_2b0._M_current = iStack_2b0._M_current + 1;
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x40);
  lVar6 = 0;
  do {
    local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffff00000000);
    p_Stack_260 = (DestroyInstanceFunc)0x0;
    local_258._M_allocated_capacity = 0xacab1d;
    local_258._8_8_ = local_258._8_8_ & 0xffffffff00000000;
    local_248 = *(char **)((long)&PTR_anon_var_dwarf_1ad9d7_00d1baa0 + lVar6);
    uStack_240 = 0x40000000000000;
    if (iStack_2b0._M_current == local_2a8) {
      std::vector<vk::VkApplicationInfo,std::allocator<vk::VkApplicationInfo>>::
      _M_realloc_insert<vk::VkApplicationInfo_const&>
                ((vector<vk::VkApplicationInfo,std::allocator<vk::VkApplicationInfo>> *)&local_2b8,
                 iStack_2b0,(VkApplicationInfo *)local_268);
    }
    else {
      (iStack_2b0._M_current)->pEngineName = local_248;
      (iStack_2b0._M_current)->engineVersion = 0;
      (iStack_2b0._M_current)->apiVersion = 0x400000;
      (iStack_2b0._M_current)->pApplicationName = "appName";
      *(undefined8 *)&(iStack_2b0._M_current)->applicationVersion = local_258._8_8_;
      *(undefined1 (*) [8])iStack_2b0._M_current = local_268;
      (iStack_2b0._M_current)->pNext = (void *)0x0;
      iStack_2b0._M_current = iStack_2b0._M_current + 1;
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x40);
  lVar6 = 0;
  do {
    local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffff00000000);
    p_Stack_260 = (DestroyInstanceFunc)0x0;
    local_258._M_allocated_capacity = 0xacab1d;
    local_258._8_4_ = *(undefined4 *)((long)&DAT_00acaff4 + lVar6);
    local_248 = "engineName";
    uStack_240 = 0x40000000000000;
    if (iStack_2b0._M_current == local_2a8) {
      std::vector<vk::VkApplicationInfo,std::allocator<vk::VkApplicationInfo>>::
      _M_realloc_insert<vk::VkApplicationInfo_const&>
                ((vector<vk::VkApplicationInfo,std::allocator<vk::VkApplicationInfo>> *)&local_2b8,
                 iStack_2b0,(VkApplicationInfo *)local_268);
    }
    else {
      (iStack_2b0._M_current)->pEngineName = "engineName";
      (iStack_2b0._M_current)->engineVersion = 0;
      (iStack_2b0._M_current)->apiVersion = 0x400000;
      (iStack_2b0._M_current)->pApplicationName = "appName";
      *(undefined8 *)&(iStack_2b0._M_current)->applicationVersion = local_258._8_8_;
      *(undefined1 (*) [8])iStack_2b0._M_current = local_268;
      (iStack_2b0._M_current)->pNext = (void *)0x0;
      iStack_2b0._M_current = iStack_2b0._M_current + 1;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0xc);
  lVar6 = 0;
  do {
    local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffff00000000);
    p_Stack_260 = (DestroyInstanceFunc)0x0;
    local_258._M_allocated_capacity = 0xacab1d;
    local_258._8_8_ = local_258._8_8_ & 0xffffffff00000000;
    local_248 = "engineName";
    uStack_240._0_4_ = *(deUint32 *)((long)&DAT_00acaff4 + lVar6);
    uStack_240._4_4_ = 0x400000;
    if (iStack_2b0._M_current == local_2a8) {
      std::vector<vk::VkApplicationInfo,std::allocator<vk::VkApplicationInfo>>::
      _M_realloc_insert<vk::VkApplicationInfo_const&>
                ((vector<vk::VkApplicationInfo,std::allocator<vk::VkApplicationInfo>> *)&local_2b8,
                 iStack_2b0,(VkApplicationInfo *)local_268);
    }
    else {
      (iStack_2b0._M_current)->pEngineName = "engineName";
      (iStack_2b0._M_current)->engineVersion = (deUint32)uStack_240;
      (iStack_2b0._M_current)->apiVersion = 0x400000;
      (iStack_2b0._M_current)->pApplicationName = "appName";
      *(undefined8 *)&(iStack_2b0._M_current)->applicationVersion = local_258._8_8_;
      *(undefined1 (*) [8])iStack_2b0._M_current = local_268;
      (iStack_2b0._M_current)->pNext = (void *)0x0;
      iStack_2b0._M_current = iStack_2b0._M_current + 1;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0xc);
  lVar6 = 0;
  do {
    local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffff00000000);
    p_Stack_260 = (DestroyInstanceFunc)0x0;
    local_258._M_allocated_capacity = 0xacab1d;
    local_258._8_8_ = local_258._8_8_ & 0xffffffff00000000;
    local_248 = "engineName";
    uStack_240 = (ulong)*(uint *)((long)&DAT_00acafd0 + lVar6) << 0x20 | 0x40000000000000;
    if (iStack_2b0._M_current == local_2a8) {
      std::vector<vk::VkApplicationInfo,std::allocator<vk::VkApplicationInfo>>::
      _M_realloc_insert<vk::VkApplicationInfo_const&>
                ((vector<vk::VkApplicationInfo,std::allocator<vk::VkApplicationInfo>> *)&local_2b8,
                 iStack_2b0,(VkApplicationInfo *)local_268);
    }
    else {
      (iStack_2b0._M_current)->pEngineName = "engineName";
      (iStack_2b0._M_current)->engineVersion = (deUint32)uStack_240;
      (iStack_2b0._M_current)->apiVersion = uStack_240._4_4_;
      (iStack_2b0._M_current)->pApplicationName = "appName";
      *(undefined8 *)&(iStack_2b0._M_current)->applicationVersion = local_258._8_8_;
      *(undefined1 (*) [8])iStack_2b0._M_current = local_268;
      (iStack_2b0._M_current)->pNext = (void *)0x0;
      iStack_2b0._M_current = iStack_2b0._M_current + 1;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x24);
  local_248 = "engineName";
  uStack_240 = 0;
  local_258._M_allocated_capacity = 0xacab1d;
  local_258._8_8_ = 0;
  local_268 = (undefined1  [8])0x0;
  p_Stack_260 = (DestroyInstanceFunc)0x0;
  if (iStack_2b0._M_current == local_2a8) {
    std::vector<vk::VkApplicationInfo,std::allocator<vk::VkApplicationInfo>>::
    _M_realloc_insert<vk::VkApplicationInfo_const&>
              ((vector<vk::VkApplicationInfo,std::allocator<vk::VkApplicationInfo>> *)&local_2b8,
               iStack_2b0,(VkApplicationInfo *)local_268);
  }
  else {
    (iStack_2b0._M_current)->pEngineName = "engineName";
    (iStack_2b0._M_current)->engineVersion = 0;
    (iStack_2b0._M_current)->apiVersion = 0;
    (iStack_2b0._M_current)->pApplicationName = "appName";
    *(undefined8 *)&(iStack_2b0._M_current)->applicationVersion = 0;
    *(undefined8 *)iStack_2b0._M_current = 0;
    (iStack_2b0._M_current)->pNext = (void *)0x0;
    iStack_2b0._M_current = iStack_2b0._M_current + 1;
  }
  if (iStack_2b0._M_current != local_2b8) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      value = (VkApplicationInfo *)((long)&local_2b8->sType + lVar6);
      local_78.pNext = (void *)0x0;
      local_78.flags = 0;
      local_78._20_4_ = 0;
      local_78.enabledExtensionCount = 0;
      local_78._52_4_ = 0;
      local_78.ppEnabledExtensionNames = (char **)0x0;
      local_78.enabledLayerCount = 0;
      local_78._36_4_ = 0;
      local_78.ppEnabledLayerNames = (char **)0x0;
      local_78.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
      local_78._4_4_ = 0;
      local_268 = (undefined1  [8])local_288;
      local_78.pApplicationInfo = value;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&p_Stack_260);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&p_Stack_260,"Creating instance with appInfo: ",0x20);
      ::vk::operator<<((ostream *)&p_Stack_260,value);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&p_Stack_260);
      std::ios_base::~ios_base(local_1f0);
      ::vk::createInstance
                ((Move<vk::VkInstance_s_*> *)local_268,local_278,&local_78,
                 (VkAllocationCallbacks *)0x0);
      uVar3 = local_258._M_allocated_capacity;
      auVar2 = local_268;
      local_290 = p_Stack_260;
      local_268 = (undefined1  [8])local_288;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&p_Stack_260);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&p_Stack_260,"Succeeded",9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&p_Stack_260);
      std::ios_base::~ios_base(local_1f0);
      if (auVar2 != (undefined1  [8])0x0) {
        (*local_290)((VkInstance)auVar2,(VkAllocationCallbacks *)uVar3);
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x30;
    } while (uVar5 < (ulong)(((long)iStack_2b0._M_current - (long)local_2b8 >> 4) *
                            -0x5555555555555555));
  }
  qVar4 = tcu::ResultCollector::getResult(&local_c8);
  local_268 = (undefined1  [8])&local_258;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_268,local_c8.m_message._M_dataplus._M_p,
             local_c8.m_message._M_dataplus._M_p + local_c8.m_message._M_string_length);
  pTVar1 = local_280;
  local_280->m_code = qVar4;
  (local_280->m_description)._M_dataplus._M_p = (pointer)&(local_280->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280->m_description,local_268,p_Stack_260 + (long)local_268);
  if (local_268 != (undefined1  [8])&local_258) {
    operator_delete((void *)local_268,(ulong)(local_258._M_allocated_capacity + 1));
  }
  if (local_2b8 != (VkApplicationInfo *)0x0) {
    operator_delete(local_2b8,(long)local_2a8 - (long)local_2b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_message._M_dataplus._M_p != &local_c8.m_message.field_2) {
    operator_delete(local_c8.m_message._M_dataplus._M_p,
                    local_c8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_prefix._M_dataplus._M_p != &local_c8.m_prefix.field_2) {
    operator_delete(local_c8.m_prefix._M_dataplus._M_p,
                    local_c8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus createInstanceTest (Context& context)
{
	tcu::TestLog&				log						= context.getTestContext().getLog();
	tcu::ResultCollector		resultCollector			(log);
	const char*					appNames[]				= { "appName", DE_NULL, "",  "app, name", "app(\"name\"", "app~!@#$%^&*()_+name", "app\nName", "app\r\nName" };
	const char*					engineNames[]			= { "engineName", DE_NULL, "",  "engine. name", "engine\"(name)", "eng~!@#$%^&*()_+name", "engine\nName", "engine\r\nName" };
	const int                   patchNumbers[]          = { 0, 1, 2, 3, 4, 5, 13, 4094, 4095 };
	const deUint32				appVersions[]			= { 0, 1, (deUint32)-1 };
	const deUint32				engineVersions[]		= { 0, 1, (deUint32)-1 };
	const PlatformInterface&	platformInterface		= context.getPlatformInterface();
	vector<VkApplicationInfo>	appInfos;

	// test over appName
	for (int appNameNdx = 0; appNameNdx < DE_LENGTH_OF_ARRAY(appNames); appNameNdx++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			appNames[appNameNdx],					// const char*					pAppName;
			0u,										// deUint32						appVersion;
			"engineName",							// const char*					pEngineName;
			0u,										// deUint32						engineVersion;
			VK_API_VERSION,							// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// test over engineName
	for (int engineNameNdx = 0; engineNameNdx < DE_LENGTH_OF_ARRAY(engineNames); engineNameNdx++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			"appName",								// const char*					pAppName;
			0u,										// deUint32						appVersion;
			engineNames[engineNameNdx],				// const char*					pEngineName;
			0u,										// deUint32						engineVersion;
			VK_API_VERSION,							// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// test over appVersion
	for (int appVersionNdx = 0; appVersionNdx < DE_LENGTH_OF_ARRAY(appVersions); appVersionNdx++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			"appName",								// const char*					pAppName;
			appVersions[appVersionNdx],				// deUint32						appVersion;
			"engineName",							// const char*					pEngineName;
			0u,										// deUint32						engineVersion;
			VK_API_VERSION,							// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// test over engineVersion
	for (int engineVersionNdx = 0; engineVersionNdx < DE_LENGTH_OF_ARRAY(engineVersions); engineVersionNdx++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			"appName",								// const char*					pAppName;
			0u,										// deUint32						appVersion;
			"engineName",							// const char*					pEngineName;
			engineVersions[engineVersionNdx],		// deUint32						engineVersion;
			VK_API_VERSION,							// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}
	// patch component of api version checking (should be ignored by implementation)
	for (int patchVersion = 0; patchVersion < DE_LENGTH_OF_ARRAY(patchNumbers); patchVersion++)
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,					// VkStructureType				sType;
			DE_NULL,											// const void*					pNext;
			"appName",											// const char*					pAppName;
			0u,													// deUint32						appVersion;
			"engineName",										// const char*					pEngineName;
			0u,													// deUint32						engineVersion;
			VK_MAKE_VERSION(1, 0, patchNumbers[patchVersion]),	// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// test when apiVersion is 0
	{
		const VkApplicationInfo appInfo =
		{
			VK_STRUCTURE_TYPE_APPLICATION_INFO,		// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			"appName",								// const char*					pAppName;
			0u,										// deUint32						appVersion;
			"engineName",							// const char*					pEngineName;
			0u,										// deUint32						engineVersion;
			0u,										// deUint32						apiVersion;
		};

		appInfos.push_back(appInfo);
	}

	// run the tests!
	for (size_t appInfoNdx = 0; appInfoNdx < appInfos.size(); ++appInfoNdx)
	{
		const VkApplicationInfo&		appInfo					= appInfos[appInfoNdx];
		const VkInstanceCreateInfo		instanceCreateInfo		=
		{
			VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO,	// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			(VkInstanceCreateFlags)0u,				// VkInstanceCreateFlags		flags;
			&appInfo,								// const VkApplicationInfo*		pAppInfo;
			0u,										// deUint32						layerCount;
			DE_NULL,								// const char*const*			ppEnabledLayernames;
			0u,										// deUint32						extensionCount;
			DE_NULL,								// const char*const*			ppEnabledExtensionNames;
		};

		log << TestLog::Message << "Creating instance with appInfo: " << appInfo << TestLog::EndMessage;

		try
		{
			const Unique<VkInstance> instance(createInstance(platformInterface, &instanceCreateInfo));
			log << TestLog::Message << "Succeeded" << TestLog::EndMessage;
		}
		catch (const vk::Error& err)
		{
			resultCollector.fail("Failed, Error code: " + de::toString(err.getMessage()));
		}
	}

	return tcu::TestStatus(resultCollector.getResult(), resultCollector.getMessage());
}